

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool Fossilize::merge_concurrent_databases_last_use
               (char *append_archive,char **source_paths,size_t num_source_paths,
               bool skip_missing_inputs)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  DatabaseInterface *pDVar4;
  mapped_type *pmVar5;
  undefined7 in_register_00000009;
  __node_base_ptr *pp_Var6;
  ulong uVar7;
  __node_base *p_Var8;
  unsigned_long *hash;
  pointer __k;
  ResourceTag tag;
  char *path;
  ulong uVar9;
  byte bVar10;
  ResourceTag tag_1;
  size_t sVar11;
  bool bVar12;
  size_t hash_count;
  size_t timestamp_size;
  uint64_t timestamp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  timestamps [10];
  size_type local_2c0;
  long local_2b8;
  undefined4 local_2ac;
  char *local_2a8;
  size_t local_2a0;
  ulong local_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_290;
  char **local_278;
  size_t local_270;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_268 [10];
  
  local_2ac = (undefined4)CONCAT71(in_register_00000009,skip_missing_inputs);
  lVar3 = 0x230;
  pp_Var6 = &local_268[0]._M_single_bucket;
  do {
    ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      *)(pp_Var6 + -6))->_M_buckets = pp_Var6;
    pp_Var6[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var6 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var6[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var6 + -2))->_M_max_load_factor = 1.0;
    pp_Var6[-1] = (__node_base_ptr)0x0;
    *pp_Var6 = (__node_base_ptr)0x0;
    pp_Var6 = pp_Var6 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  local_2a8 = append_archive;
  local_2a0 = num_source_paths;
  local_278 = source_paths;
  if (num_source_paths != 0xffffffffffffffff) {
    sVar11 = 0;
    do {
      path = local_2a8;
      if (sVar11 != 0) {
        path = local_278[sVar11 - 1];
      }
      pDVar4 = create_stream_archive_database(path,ReadOnly);
      iVar2 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4);
      local_270 = sVar11;
      if ((char)iVar2 == '\0') {
        if ((sVar11 != 0 & (byte)local_2ac) == 1) {
          fprintf(_stderr,"Fossilize WARN: Archive %s could not be prepared, skipping.\n",path);
          bVar10 = 4;
        }
        else {
          bVar10 = (sVar11 == 0) * '\x03' + 1;
        }
      }
      else {
        uVar9 = 0;
        do {
          local_2c0 = 0;
          iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar9 & 0xffffffff,&local_2c0,0);
          bVar10 = 1;
          if ((char)iVar2 != '\0') {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_290,local_2c0,(allocator_type *)&local_2b8);
            iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar9 & 0xffffffff,&local_2c0);
            puVar1 = local_290.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            bVar10 = 1;
            if ((char)iVar2 != '\0') {
              if (local_290.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  local_290.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                bVar10 = 0;
              }
              else {
                __k = local_290.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
                do {
                  local_2b8 = 8;
                  local_298 = 0;
                  iVar2 = (*pDVar4->_vptr_DatabaseInterface[3])
                                    (pDVar4,uVar9 & 0xffffffff,*__k,&local_2b8,&local_298,0);
                  if (((char)iVar2 == '\0') || (local_2b8 != 8)) goto LAB_001774ef;
                  pmVar5 = std::__detail::
                           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)(local_268 + uVar9),__k);
                  uVar7 = local_298;
                  if (local_298 < *pmVar5) {
                    uVar7 = *pmVar5;
                  }
                  *pmVar5 = uVar7;
                  __k = __k + 1;
                } while (__k != puVar1);
                bVar10 = 0;
              }
            }
LAB_001774ef:
            if (local_290.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (key_type *)0x0) {
              operator_delete(local_290.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_290.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_290.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (bVar10 != 0) goto LAB_0017751e;
          uVar9 = uVar9 + 1;
        } while (uVar9 != 10);
        bVar10 = 5;
LAB_0017751e:
        if (bVar10 == 5) {
          bVar10 = 0;
        }
      }
      (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
      if ((bVar10 & 3) != 0) goto LAB_00177598;
      sVar11 = local_270 + 1;
    } while (local_270 != local_2a0);
    bVar10 = 2;
LAB_00177598:
    if (bVar10 != 2) {
      bVar12 = false;
      goto LAB_00177628;
    }
  }
  pDVar4 = create_stream_archive_database(local_2a8,OverWrite);
  iVar2 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4);
  if ((char)iVar2 == '\0') {
    bVar12 = false;
  }
  else {
    uVar9 = 0;
    bVar12 = false;
    do {
      p_Var8 = &local_268[uVar9]._M_before_begin;
      while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
        iVar2 = (*pDVar4->_vptr_DatabaseInterface[4])
                          (pDVar4,uVar9 & 0xffffffff,p_Var8[1]._M_nxt,
                           (_Prime_rehash_policy *)(p_Var8 + 2),8,8);
        if ((char)iVar2 == '\0') goto LAB_0017761b;
      }
      bVar12 = 8 < uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 10);
  }
LAB_0017761b:
  (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
LAB_00177628:
  lVar3 = 0x1f8;
  do {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)&local_268[0]._M_buckets + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x38);
  return bVar12;
}

Assistant:

bool merge_concurrent_databases_last_use(const char *append_archive, const char * const *source_paths, size_t num_source_paths,
                                         bool skip_missing_inputs)
{
	std::unordered_map<Hash, uint64_t> timestamps[RESOURCE_COUNT];

	for (size_t source = 0; source < num_source_paths + 1; source++)
	{
		const char *path = source ? source_paths[source - 1] : append_archive;
		auto source_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(path, DatabaseMode::ReadOnly));
		if (!source_db->prepare())
		{
			if (source == 0)
				continue;
			else
			{
				if (!skip_missing_inputs)
					return false;

				LOGW("Archive %s could not be prepared, skipping.\n", path);
				continue;
			}
		}

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);

			size_t hash_count = 0;
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			std::vector<Hash> hashes(hash_count);
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
				return false;

			for (auto &hash : hashes)
			{
				size_t timestamp_size = sizeof(uint64_t);
				uint64_t timestamp = 0;
				if (!source_db->read_entry(tag, hash, &timestamp_size, &timestamp, PAYLOAD_READ_NO_FLAGS) ||
				    timestamp_size != sizeof(uint64_t))
					return false;

				auto &entry = timestamps[i][hash];
				entry = std::max<uint64_t>(entry, timestamp);
			}
		}
	}

	auto write_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(append_archive, DatabaseMode::OverWrite));
	if (!write_db->prepare())
		return false;

	for (unsigned i = 0; i < RESOURCE_COUNT; i++)
	{
		auto tag = static_cast<ResourceTag>(i);
		auto &ts = timestamps[i];

		for (auto &t : ts)
			if (!write_db->write_entry(tag, t.first, &t.second, sizeof(t.second), PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT))
				return false;
	}

	return true;
}